

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O3

void av1_gop_setup_structure(AV1_COMP *cpi)

{
  FRAME_INFO *rc;
  _Bool *p_Var1;
  GF_GROUP *gf_group;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  int iVar2;
  uint uVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  FRAME_TYPE FVar14;
  int *piVar15;
  int start;
  bool bVar16;
  int in_stack_ffffffffffffff98;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  int parallel_frame_count;
  ulong local_50;
  int local_44;
  int *local_40;
  int *local_38;
  
  pAVar5 = cpi->ppi;
  local_44 = (cpi->rc).frames_since_key;
  if (local_44 == 0) {
    iVar10 = (cpi->oxcf).kf_max_pyr_height;
    if (iVar10 != -1) {
      iVar11 = (pAVar5->gf_group).max_layer_depth_allowed;
      if (iVar10 < iVar11) {
        iVar11 = iVar10;
      }
      (pAVar5->gf_group).max_layer_depth_allowed = iVar11;
    }
    uVar6 = (pAVar5->p_rc).baseline_gf_interval;
    bVar16 = false;
    uVar8 = 0;
  }
  else {
    bVar16 = (pAVar5->gf_state).arf_gf_boost_lst == 0;
    uVar6 = (pAVar5->p_rc).baseline_gf_interval;
    uVar8 = (cpi->common).current_frame.frame_number;
  }
  local_40 = &(pAVar5->p_rc).baseline_gf_interval;
  local_50 = (ulong)uVar6;
  local_5c = 0;
  local_64 = 0;
  piVar15 = (pAVar5->gf_group).frame_parallel_level;
  local_60 = uVar8;
  memset((pAVar5->gf_group).src_offset,0,1000);
  local_38 = piVar15;
  memset(piVar15,0,0x5dc);
  iVar11 = 0x3c387b;
  memset((pAVar5->gf_group).skip_frame_refresh,0xff,9000);
  iVar10 = (int)local_50;
  if (local_44 == 0) {
    bVar16 = 1 < (cpi->oxcf).kf_cfg.enable_keyframe_filtering;
    (pAVar5->gf_group).update_type[0] = (bVar16 && iVar10 != 0xfa) * '\x03';
    (pAVar5->gf_group).arf_src_offset[0] = '\0';
    (pAVar5->gf_group).cur_frame_idx[0] = '\0';
    (pAVar5->gf_group).layer_depth[0] = 0;
    (pAVar5->gf_group).frame_type[0] = '\0';
    (pAVar5->gf_group).refbuf_state[0] = '\0';
    (pAVar5->gf_group).max_layer_depth = 0;
    (pAVar5->gf_group).display_idx[0] = uVar8;
    local_58 = 1;
    uVar6 = 1;
    if (bVar16 && iVar10 != 0xfa) {
      (pAVar5->gf_group).update_type[1] = '\x04';
      (pAVar5->gf_group).arf_src_offset[1] = '\0';
      (pAVar5->gf_group).cur_frame_idx[1] = '\0';
      (pAVar5->gf_group).layer_depth[1] = 0;
      (pAVar5->gf_group).frame_type[1] = '\x01';
      (pAVar5->gf_group).refbuf_state[1] = '\x01';
      (pAVar5->gf_group).display_idx[1] = uVar8;
      uVar6 = 2;
    }
    uVar8 = uVar8 + 1;
    local_5c = 1;
    bVar16 = false;
    local_64 = uVar6;
    local_60 = uVar8;
  }
  else if (bVar16) {
    (pAVar5->gf_group).update_type[0] = '\x02';
    (pAVar5->gf_group).arf_src_offset[0] = '\0';
    (pAVar5->gf_group).cur_frame_idx[0] = '\0';
    (pAVar5->gf_group).layer_depth[0] = 0;
    bVar16 = true;
    (pAVar5->gf_group).frame_type[0] = '\x01';
    (pAVar5->gf_group).refbuf_state[0] = '\x01';
    (pAVar5->gf_group).max_layer_depth = 0;
    (pAVar5->gf_group).display_idx[0] = uVar8;
    uVar8 = uVar8 + 1;
    local_58 = 1;
    local_64 = 1;
    local_5c = 1;
    uVar6 = 1;
    local_60 = uVar8;
  }
  else {
    uVar6 = 0;
    bVar16 = false;
    local_58 = 0;
  }
  iVar12 = (pAVar5->gf_group).max_layer_depth_allowed;
  iVar2 = (cpi->rc).frames_to_fwd_kf;
  local_50 = CONCAT44(local_50._4_4_,iVar2);
  uVar3 = (cpi->oxcf).kf_cfg.sframe_dist;
  iVar4 = (cpi->oxcf).kf_cfg.sframe_mode;
  if (0 < (int)uVar3 && 0 < iVar4) {
    if (iVar4 == 2) {
      p_Var1 = &(pAVar5->gf_group).is_sframe_due;
      *p_Var1 = (_Bool)(*p_Var1 | (uVar6 != 0 && uVar6 % uVar3 == 0));
    }
    else if (iVar4 == 1) {
      (pAVar5->gf_group).is_sframe_due = 0 < iVar12;
    }
  }
  gf_group = &pAVar5->gf_group;
  twopass = &pAVar5->twopass;
  rc = &cpi->frame_info;
  p_rc = &pAVar5->p_rc;
  start = iVar10 + -1;
  if (iVar12 < 1) {
    (pAVar5->gf_group).arf_index = -1;
    parallel_frame_count = 1;
    set_multi_layer_params
              (twopass,&cpi->twopass_frame,gf_group,p_rc,(RATE_CONTROL *)rc,
               (FRAME_INFO *)(ulong)local_58,start,(int)&local_5c,(int *)&local_64,
               &parallel_frame_count,(int *)(ulong)(uint)cpi->ppi->num_fp_contexts,0,(int)&local_58,
               (int *)&local_60,(int *)0x1,iVar11);
    uVar8 = local_64;
    if ((int)local_5c < iVar10) {
      lVar7 = (long)(int)local_64;
      lVar13 = 0;
      do {
        (pAVar5->gf_group).update_type[lVar13 + lVar7] = '\x01';
        (pAVar5->gf_group).arf_src_offset[lVar13 + lVar7] = '\0';
        (pAVar5->gf_group).cur_frame_idx[lVar13 + lVar7] = (uchar)((ulong)local_5c + lVar13);
        (pAVar5->gf_group).layer_depth[lVar7 + lVar13] = 6;
        (pAVar5->gf_group).arf_boost[lVar7 + lVar13] = 100;
        (pAVar5->gf_group).frame_type[lVar13 + lVar7] = '\x01';
        (pAVar5->gf_group).refbuf_state[lVar13 + lVar7] = '\x01';
        iVar11 = (pAVar5->gf_group).max_layer_depth;
        if (iVar11 < 3) {
          iVar11 = 2;
        }
        (pAVar5->gf_group).max_layer_depth = iVar11;
        iVar11 = (pAVar5->gf_group).frame_parallel_level[lVar7 + lVar13];
        if (0 < iVar11) {
          if (iVar11 == 1) {
            local_58 = (uint)((ulong)local_5c + lVar13);
          }
          (pAVar5->gf_group).src_offset[lVar7 + lVar13] =
               ((pAVar5->gf_group).arf_src_offset[lVar13 + lVar7] - local_58) + local_5c +
               (int)lVar13;
        }
        (pAVar5->gf_group).display_idx[lVar7 + lVar13] = local_60 + (int)lVar13;
        lVar13 = lVar13 + 1;
      } while ((local_5c - iVar10) + (int)lVar13 != 0);
      uVar8 = (int)lVar13 + local_64;
    }
    goto LAB_003c3e5b;
  }
  (pAVar5->gf_group).update_type[uVar6] = '\x03';
  (pAVar5->gf_group).arf_src_offset[uVar6] = (char)start - (uchar)local_58;
  (pAVar5->gf_group).cur_frame_idx[uVar6] = (uchar)local_58;
  (pAVar5->gf_group).layer_depth[uVar6] = 1;
  (pAVar5->gf_group).arf_boost[uVar6] = (cpi->ppi->p_rc).gfu_boost;
  if (iVar2 == start) {
    FVar14 = '\0';
  }
  else {
    FVar14 = (pAVar5->gf_group).is_sframe_due * '\x02' + '\x01';
  }
  (pAVar5->gf_group).frame_type[uVar6] = FVar14;
  (pAVar5->gf_group).is_sframe_due = (0 < (int)uVar3 && 0 < iVar4) && FVar14 != '\x03';
  (pAVar5->gf_group).refbuf_state[uVar6] = '\x01';
  (pAVar5->gf_group).max_layer_depth = 1;
  (pAVar5->gf_group).arf_index = uVar6;
  (pAVar5->gf_group).display_idx[uVar6] = uVar8 + (pAVar5->gf_group).arf_src_offset[uVar6];
  local_64 = uVar6 + 1;
  parallel_frame_count = 1;
  uVar8 = cpi->ppi->num_fp_contexts;
  if ((int)uVar8 < 2) {
    uVar6 = 0;
LAB_003c3d77:
    set_multi_layer_params
              (twopass,&cpi->twopass_frame,gf_group,p_rc,(RATE_CONTROL *)rc,
               (FRAME_INFO *)(ulong)local_58,start,(int)&local_5c,(int *)&local_64,
               &parallel_frame_count,(int *)(ulong)uVar8,uVar6,(int)&local_58,(int *)&local_60,
               (int *)0x2,iVar11);
    bVar16 = false;
  }
  else {
    iVar12 = (pAVar5->gf_group).max_layer_depth_allowed;
    uVar6 = (uint)(3 < iVar12);
    if (iVar12 < 4) goto LAB_003c3d77;
    if (bVar16) {
      iVar10 = start;
    }
    if (local_44 == 0) {
      iVar10 = start;
    }
    uVar6 = 0x7fffffff;
    if (iVar10 == 0x20) {
      uVar6 = 4;
    }
    piVar15 = (int *)0x3;
    if (iVar10 != 0x10) {
      piVar15 = (int *)(ulong)uVar6;
    }
    set_multi_layer_params_for_fp
              (twopass,&cpi->twopass_frame,gf_group,p_rc,(RATE_CONTROL *)rc,
               (FRAME_INFO *)(ulong)local_58,start,(int)&local_5c,(int *)&local_64,
               &parallel_frame_count,(int *)(ulong)uVar8,(uint)(3 < iVar12),(int)&local_58,piVar15,
               (int)&local_60,(int *)0x2,in_stack_ffffffffffffff98);
    bVar16 = true;
  }
  lVar7 = (long)(int)local_64;
  (pAVar5->gf_group).update_type[lVar7] = '\x04';
  (pAVar5->gf_group).arf_src_offset[lVar7] = '\0';
  (pAVar5->gf_group).cur_frame_idx[lVar7] = (uchar)local_5c;
  (pAVar5->gf_group).layer_depth[lVar7] = 6;
  (pAVar5->gf_group).arf_boost[lVar7] = 100;
  (pAVar5->gf_group).frame_type[lVar7] = '\x01';
  (pAVar5->gf_group).refbuf_state[lVar7] = (int)local_50 != start;
  (pAVar5->gf_group).display_idx[lVar7] = local_60;
  uVar8 = local_64 + 1;
  if (bVar16) {
    if (-1 < (int)local_64) {
      iVar10 = 0x7fffffff;
      uVar9 = 0;
      iVar11 = 0;
      do {
        iVar12 = local_38[uVar9];
        if (iVar12 == 1) {
          if ((iVar10 == 0x7fffffff) || (iVar11 != 0)) {
            iVar12 = 1;
          }
          else {
            local_38[iVar10] = 0;
            iVar12 = local_38[uVar9];
          }
          iVar11 = 0;
          iVar10 = (int)uVar9;
        }
        iVar11 = iVar11 + (uint)(iVar12 == 2);
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (local_38[lVar7 + -1] == 1) {
      local_38[lVar7 + -1] = 0;
    }
  }
LAB_003c3e5b:
  if ((int)uVar8 < 0xfa) {
    lVar7 = (long)(int)uVar8;
    do {
      (pAVar5->gf_group).update_type[lVar7] = '\x01';
      (pAVar5->gf_group).arf_src_offset[lVar7] = '\0';
      (pAVar5->gf_group).cur_frame_idx[lVar7] = (uchar)lVar7;
      (pAVar5->gf_group).layer_depth[lVar7] = 6;
      (pAVar5->gf_group).arf_boost[lVar7] = 100;
      (pAVar5->gf_group).frame_type[lVar7] = '\x01';
      (pAVar5->gf_group).refbuf_state[lVar7] = '\x01';
      iVar10 = (pAVar5->gf_group).max_layer_depth;
      if (iVar10 < 3) {
        iVar10 = 2;
      }
      (pAVar5->gf_group).max_layer_depth = iVar10;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0xfa);
  }
  (pAVar5->gf_group).size = uVar8;
  if ((pAVar5->gf_group).max_layer_depth_allowed == 0) {
    uVar6 = 0xffffffff;
    do {
      uVar6 = uVar6 + 1;
    } while (1 << ((byte)uVar6 & 0x1f) < *local_40);
    if (0 < (int)uVar8) {
      lVar7 = 0;
      do {
        uVar8 = 0;
        do {
          if (((uint)lVar7 >> (uVar8 & 0x1f) & 1) != 0) goto LAB_003c3f15;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 6);
        uVar8 = 6;
LAB_003c3f15:
        iVar10 = uVar6 - uVar8;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        (pAVar5->gf_group).layer_depth[lVar7] = iVar10;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pAVar5->gf_group).size);
    }
    uVar8 = 6;
    if (uVar6 < 6) {
      uVar8 = uVar6;
    }
    (pAVar5->gf_group).max_layer_depth = uVar8;
  }
  return;
}

Assistant:

void av1_gop_setup_structure(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  const int key_frame = rc->frames_since_key == 0;
  FRAME_UPDATE_TYPE first_frame_update_type = ARF_UPDATE;

  if (key_frame) {
    first_frame_update_type = KF_UPDATE;
    if (cpi->oxcf.kf_max_pyr_height != -1) {
      gf_group->max_layer_depth_allowed = AOMMIN(
          cpi->oxcf.kf_max_pyr_height, gf_group->max_layer_depth_allowed);
    }
  } else if (!cpi->ppi->gf_state.arf_gf_boost_lst) {
    first_frame_update_type = GF_UPDATE;
  }

  gf_group->size = construct_multi_layer_gf_structure(
      cpi, twopass, gf_group, rc, frame_info, p_rc->baseline_gf_interval,
      first_frame_update_type);

  if (gf_group->max_layer_depth_allowed == 0)
    set_ld_layer_depth(gf_group, p_rc->baseline_gf_interval);
}